

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t __thiscall
jessilib::find<char,false>
          (jessilib *this,basic_string_view<char,_std::char_traits<char>_> in_string,
          char32_t in_codepoint)

{
  int iVar1;
  int iVar2;
  char *extraout_RDX;
  char *pcVar3;
  size_t sVar4;
  char *extraout_RDX_00;
  size_t sVar5;
  size_t sVar6;
  decode_result dVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  sVar6 = in_string._M_len;
  if (this != (jessilib *)0x0) {
    iVar1 = jessilib::fold((wchar32)in_string._M_str);
    sVar5 = 0;
    pcVar3 = extraout_RDX;
    for (; this != (jessilib *)0x0; this = this + -sVar4) {
      in_string_00._M_str = pcVar3;
      in_string_00._M_len = sVar6;
      dVar7 = decode_codepoint_utf8<char>(this,in_string_00);
      sVar4 = dVar7.units;
      if (sVar4 == 0) {
        return 0xffffffffffffffff;
      }
      iVar2 = jessilib::fold(dVar7.codepoint);
      if (iVar2 == iVar1) {
        return sVar5;
      }
      sVar6 = sVar6 + sVar4;
      sVar5 = sVar5 + sVar4;
      pcVar3 = extraout_RDX_00;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, char32_t in_codepoint) {
	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	if constexpr (!CaseSensitive) {
		in_codepoint = fold(in_codepoint);
	}

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		std::basic_string_view<LhsCharT> string = in_string;
		decode_result string_front = decode_codepoint(string);

		if (string_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return decltype(in_string)::npos;
		}

		if constexpr (CaseSensitive) {
			if (string_front.codepoint == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}
		else {
			if (fold(string_front.codepoint) == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}